

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBuffer::commandsAfterCompute
          (MemoryQualifierInstanceBuffer *this,VkCommandBuffer cmdBuffer,
          VkDeviceSize bufferSizeInBytes)

{
  DeviceInterface *pDVar1;
  VkBufferMemoryBarrier shaderWriteBarrier;
  
  pDVar1 = Context::getDeviceInterface
                     ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  makeBufferMemoryBarrier
            (&shaderWriteBarrier,0x40,0x2000,
             (VkBuffer)
             (((this->super_MemoryQualifierInstanceBase).m_buffer.
               super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.
              ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
             ,0,bufferSizeInBytes);
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,cmdBuffer,0x800,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
  return;
}

Assistant:

void MemoryQualifierInstanceBuffer::commandsAfterCompute (const VkCommandBuffer cmdBuffer, const VkDeviceSize bufferSizeInBytes) const
{
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();

	const VkBufferMemoryBarrier shaderWriteBarrier
		= makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT,
								  VK_ACCESS_HOST_READ_BIT,
								  m_buffer->get(),
								  0ull,
								  bufferSizeInBytes);

	deviceInterface.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
}